

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

BlockInfo * __thiscall
Wasm::WasmBytecodeGenerator::GetBlockInfo(WasmBytecodeGenerator *this,uint32 relativeDepth)

{
  uint uVar1;
  BlockInfo **ppBVar2;
  WasmCompilationException *this_00;
  
  uVar1 = (this->m_blockInfos).list.
          super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count;
  if (relativeDepth < uVar1) {
    ppBVar2 = JsUtil::ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>::Item
                        ((ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer> *
                         )&this->m_blockInfos,uVar1 + ~relativeDepth);
    return *ppBVar2;
  }
  this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException(this_00,L"Invalid branch target");
  __cxa_throw(this_00,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

BlockInfo* WasmBytecodeGenerator::GetBlockInfo(uint32 relativeDepth) const
{
    if (relativeDepth >= (uint32)m_blockInfos.Count())
    {
        throw WasmCompilationException(_u("Invalid branch target"));
    }
    return m_blockInfos.Peek(relativeDepth);
}